

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::ClipControlDepthModeZeroToOneTest::iterate(ClipControlDepthModeZeroToOneTest *this)

{
  long *plVar1;
  int *piVar2;
  TestLog *log;
  RenderContext *renderCtx;
  TestContext *this_00;
  int iVar3;
  deUint32 err;
  qpTestResult result;
  undefined4 extraout_var;
  ShaderProgram *this_01;
  long *plVar5;
  char *description;
  TestError *this_02;
  long lVar6;
  SharedPtr<glu::ShaderProgram> program;
  ClipControlApi cc;
  float vertex_data0 [12];
  value_type local_158;
  value_type local_138;
  ClipControlApi local_118;
  ProgramSources local_108;
  long lVar4;
  
  log = ((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
         super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar3 = (*((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
            m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  ClipControlApi::ClipControlApi
            (&local_118,
             (this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
             m_context,(this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.m_api);
  (**(code **)(lVar4 + 0x1c0))(0x3f800000,0,0,0x3f800000);
  (**(code **)(lVar4 + 0x188))(0x4000);
  (**(code **)(lVar4 + 0x1c8))(0);
  (**(code **)(lVar4 + 0x188))(0x100);
  (*local_118.clipControl)(0x8ca1,0x935f);
  err = (**(code **)(lVar4 + 0x800))();
  glu::checkError(err,"ClipControl()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
                  ,0x27a);
  (**(code **)(lVar4 + 0x5e0))(0xb71);
  (**(code **)(lVar4 + 0x4a0))(0x207);
  this_01 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
              m_context)->m_renderCtx;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,
             "#version 400\nin vec3 Position;\nvoid main() {\n    gl_Position = vec4(Position, 1.0);\n}"
             ,"");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,
             "#version 400\nout vec4 FragColor;\nvoid main() {\n    FragColor = vec4(0.0, 1.0, 0.0, 1.0);\n}"
             ,"");
  local_108.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_108._193_8_ = 0;
  local_108.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_108.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_108,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_108.sources,&local_138);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_108.sources + 1,&local_158);
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,&local_108);
  plVar5 = (long *)operator_new(0x20);
  *(undefined4 *)(plVar5 + 1) = 0;
  *(undefined4 *)((long)plVar5 + 0xc) = 0;
  *plVar5 = (long)&PTR__SharedPtrState_02126da8;
  plVar5[2] = (long)this_01;
  *(undefined4 *)(plVar5 + 1) = 1;
  *(undefined4 *)((long)plVar5 + 0xc) = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_108.attribLocationBindings);
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_108.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  glu::operator<<(log,this_01);
  if ((this_01->m_program).m_info.linkOk == false) {
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Program compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cClipControlTests.cpp"
               ,0x287);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar4 + 0x708))(1,&this->m_vao);
  (**(code **)(lVar4 + 0xd8))(this->m_vao);
  (**(code **)(lVar4 + 0x6c8))(1,&this->m_vbo);
  local_108.sources[1].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
  local_108.sources[1].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_3f8000003f800000;
  local_108.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xbf800000;
  local_108.sources[1].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f800000bf800000;
  local_108.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xbf800000;
  local_108.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0xbf800000;
  local_108.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xbf800000;
  local_108.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0x3f800000;
  (**(code **)(lVar4 + 0x40))(0x8892,this->m_vbo);
  (**(code **)(lVar4 + 0x150))(0x8892,0x30,&local_108,0x88e4);
  (**(code **)(lVar4 + 0x19f0))(0,3,0x1406,0,0,0);
  (**(code **)(lVar4 + 0x610))(0);
  (**(code **)(lVar4 + 0x1680))((this_01->m_program).m_program);
  (**(code **)(lVar4 + 0x538))(5,0,4);
  result = ValidateFramebuffer(this,(this->super_ClipControlRenderBaseTest).
                                    super_ClipControlBaseTest.super_TestCase.m_context);
  this_00 = (this->super_ClipControlRenderBaseTest).super_ClipControlBaseTest.super_TestCase.
            super_TestCase.super_TestNode.m_testCtx;
  description = qpGetTestResultName(result);
  tcu::TestContext::setTestResult(this_00,result,description);
  if (plVar5 != (long *)0x0) {
    LOCK();
    plVar1 = plVar5 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar5 + 0x10))();
    }
    LOCK();
    piVar2 = (int *)((long)plVar5 + 0xc);
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if ((*piVar2 == 0) && (plVar5 != (long *)0x0)) {
      (**(code **)(*plVar5 + 8))();
    }
  }
  return STOP;
}

Assistant:

IterateResult iterate()
	{

		tcu::TestLog&		  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
		ClipControlApi		  cc(m_context, m_api);

		gl.clearColor(1.0, 0.0, 0.0, 1.0);
		gl.clear(GL_COLOR_BUFFER_BIT);

		//Clear the depth buffer to 0.5.
		gl.clearDepth(0.5);
		gl.clear(GL_DEPTH_BUFFER_BIT);

		//Set ClipControl(LOWER_LEFT, ZERO_TO_ONE)
		cc.clipControl(GL_LOWER_LEFT, GL_ZERO_TO_ONE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ClipControl()");

		//Enable(DEPTH_TEST) with DepthFunc(ALWAYS)
		gl.enable(GL_DEPTH_TEST);
		gl.depthFunc(GL_ALWAYS);

		//Render a triangle fan coverage (-1.0,-1.0,-1.0) to (1.0,1.0,1.0).
		de::SharedPtr<glu::ShaderProgram> program(
			new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vsh(), fsh())));

		log << (*program);
		if (!program->isOk())
		{
			TCU_FAIL("Program compilation failed");
		}

		gl.genVertexArrays(1, &m_vao);
		gl.bindVertexArray(m_vao);

		gl.genBuffers(1, &m_vbo);

		const float vertex_data0[] = {
			-1.0, -1.0, -1.0, 1.0, -1.0, 0.0, -1.0, 1.0, 0.0, 1.0, 1.0, 1.0,
		};

		gl.bindBuffer(GL_ARRAY_BUFFER, m_vbo);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertex_data0), vertex_data0, GL_STATIC_DRAW);

		gl.vertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 0, 0);
		gl.enableVertexAttribArray(0);

		gl.useProgram(program->getProgram());

		//test method modification: use GL_TRIANGLE_STRIP, not FAN.
		gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);

		//Read back the floating-point depth buffer with ReadPixels
		//Verify that the pixels with a Z clip coordinate less than 0.0 are
		//  clipped and those coordinates from 0.0 to 1.0 update the depth
		//  buffer with values 0.0 to 1.0.
		qpTestResult result = ValidateFramebuffer(m_context);
		m_testCtx.setTestResult(result, qpGetTestResultName(result));

		return STOP;
	}